

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reduction.cpp
# Opt level: O0

float ncnn::reduction(float v0,float *ptr,int size,int stride,int op_type)

{
  int in_ECX;
  undefined4 in_EDX;
  undefined4 in_ESI;
  undefined8 in_RDI;
  float in_XMM0_Da;
  int in_stack_ffffffffffffffe0;
  float v0_00;
  float local_4;
  
  v0_00 = (float)((ulong)in_RDI >> 0x20);
  if (in_ECX == 0) {
    local_4 = reduction<ncnn::reduction_op_add>
                        (v0_00,(float *)CONCAT44(in_ESI,in_EDX),0,in_stack_ffffffffffffffe0);
  }
  else if (in_ECX == 1) {
    local_4 = reduction<ncnn::reduction_op_asum>
                        (v0_00,(float *)CONCAT44(in_ESI,in_EDX),1,in_stack_ffffffffffffffe0);
  }
  else if (in_ECX == 2) {
    local_4 = reduction<ncnn::reduction_op_sumsq>
                        (v0_00,(float *)CONCAT44(in_ESI,in_EDX),2,in_stack_ffffffffffffffe0);
  }
  else if (in_ECX == 6) {
    local_4 = reduction<ncnn::reduction_op_mul>
                        (v0_00,(float *)CONCAT44(in_ESI,in_EDX),6,in_stack_ffffffffffffffe0);
  }
  else if (in_ECX == 4) {
    local_4 = reduction<ncnn::reduction_op_max>
                        (v0_00,(float *)CONCAT44(in_ESI,in_EDX),4,in_stack_ffffffffffffffe0);
  }
  else if (in_ECX == 5) {
    local_4 = reduction<ncnn::reduction_op_min>
                        (v0_00,(float *)CONCAT44(in_ESI,in_EDX),5,in_stack_ffffffffffffffe0);
  }
  else {
    local_4 = in_XMM0_Da;
    if (in_ECX == 10) {
      local_4 = reduction<ncnn::reduction_op_sumexp>
                          (v0_00,(float *)CONCAT44(in_ESI,in_EDX),10,in_stack_ffffffffffffffe0);
    }
  }
  return local_4;
}

Assistant:

static float reduction(float v0, const float* ptr, int size, int stride, int op_type)
{
    if (op_type == Reduction::ReductionOp_SUM) return reduction<reduction_op_add>(v0, ptr, size, stride);
    if (op_type == Reduction::ReductionOp_ASUM) return reduction<reduction_op_asum>(v0, ptr, size, stride);
    if (op_type == Reduction::ReductionOp_SUMSQ) return reduction<reduction_op_sumsq>(v0, ptr, size, stride);
    if (op_type == Reduction::ReductionOp_PROD) return reduction<reduction_op_mul>(v0, ptr, size, stride);
    if (op_type == Reduction::ReductionOp_MAX) return reduction<reduction_op_max>(v0, ptr, size, stride);
    if (op_type == Reduction::ReductionOp_MIN) return reduction<reduction_op_min>(v0, ptr, size, stride);
    if (op_type == Reduction::ReductionOp_LogSumExp) return reduction<reduction_op_sumexp>(v0, ptr, size, stride);

    // should never reach here
    return v0;
}